

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# column_data.cpp
# Opt level: O2

void __thiscall
duckdb::ColumnData::GetColumnSegmentInfo
          (ColumnData *this,idx_t row_group_index,vector<unsigned_long,_true> *col_path,
          vector<duckdb::ColumnSegmentInfo,_true> *result)

{
  CompressionFunction *pCVar1;
  compression_get_segment_info_t p_Var2;
  pointer ppVar3;
  reference pvVar4;
  ColumnSegment *pCVar5;
  CompressedSegmentState *pCVar6;
  CompressionType type;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_R8;
  ulong __n;
  pointer ppVar7;
  lock_guard<std::mutex> l;
  optional_ptr<duckdb::CompressedSegmentState,_true> segment_state;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  sinfo;
  ColumnSegmentInfo column_info;
  string col_path_str;
  InsertionOrderPreservingMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  segment_info;
  allocator local_2a1;
  ColumnSegment *local_2a0;
  pthread_mutex_t *local_298;
  idx_t local_290;
  _Head_base<0UL,_duckdb::CompressedSegmentState_*,_false> local_288;
  vector<duckdb::ColumnSegmentInfo,std::allocator<duckdb::ColumnSegmentInfo>> *local_280;
  ColumnData *local_278;
  LogicalType *local_270;
  vector<unsigned_long,_true> *local_268;
  pointer local_260;
  undefined8 local_258;
  undefined8 uStack_250;
  undefined8 local_248;
  undefined1 local_238 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_228;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_218;
  idx_t local_208;
  _Alloc_hider local_200;
  size_type local_1f8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1f0;
  idx_t local_1e0;
  __int_type local_1d8;
  _Alloc_hider local_1d0;
  size_type local_1c8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1c0;
  _Alloc_hider local_1b0;
  size_type local_1a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1a0;
  bool local_190;
  bool local_18f;
  block_id_t local_188;
  vector<long,_std::allocator<long>_> local_180;
  idx_t local_168;
  _Alloc_hider local_160;
  size_type local_158;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_150;
  string local_140 [32];
  string local_120;
  InsertionOrderPreservingMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_100;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  string local_90;
  string local_70 [32];
  string local_50;
  
  local_280 = (vector<duckdb::ColumnSegmentInfo,std::allocator<duckdb::ColumnSegmentInfo>> *)result;
  local_260 = (pointer)row_group_index;
  ::std::__cxx11::string::string(local_140,"[",(allocator *)local_238);
  for (__n = 0; __n < (ulong)((long)(col_path->
                                    super_vector<unsigned_long,_std::allocator<unsigned_long>_>).
                                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                              (long)(col_path->
                                    super_vector<unsigned_long,_std::allocator<unsigned_long>_>).
                                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                    ._M_impl.super__Vector_impl_data._M_start >> 3); __n = __n + 1)
  {
    if (__n != 0) {
      ::std::__cxx11::string::append((char *)local_140);
    }
    pvVar4 = vector<unsigned_long,_true>::get<true>(col_path,__n);
    ::std::__cxx11::to_string((string *)local_238,*pvVar4);
    ::std::__cxx11::string::append(local_140);
    ::std::__cxx11::string::~string((string *)local_238);
  }
  ::std::__cxx11::string::append((char *)local_140);
  local_268 = col_path;
  pCVar5 = SegmentTree<duckdb::ColumnSegment,_false>::GetRootSegment
                     (&(this->data).super_SegmentTree<duckdb::ColumnSegment,_false>);
  local_270 = &this->type;
  local_298 = (pthread_mutex_t *)&this->stats_lock;
  local_290 = 0;
  local_278 = this;
  while (local_2a0 = pCVar5, pCVar5 != (ColumnSegment *)0x0) {
    local_228._M_allocated_capacity = (size_type)&local_218;
    local_228._8_8_ = 0;
    local_218._M_local_buf[0] = '\0';
    local_200._M_p = (pointer)&local_1f0;
    local_1f8 = 0;
    local_1f0._M_local_buf[0] = '\0';
    local_1d0._M_p = (pointer)&local_1c0;
    local_1c8 = 0;
    local_1c0._M_local_buf[0] = '\0';
    local_1b0._M_p = (pointer)&local_1a0;
    local_1a8 = 0;
    local_1a0._M_local_buf[0] = '\0';
    local_180.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    local_180.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    local_180.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    local_160._M_p = (pointer)&local_150;
    local_158 = 0;
    local_150._M_local_buf[0] = '\0';
    local_238._0_8_ = local_260;
    pvVar4 = vector<unsigned_long,_true>::get<true>(local_268,0);
    local_238._8_8_ = *pvVar4;
    ::std::__cxx11::string::_M_assign((string *)(local_238 + 0x10));
    local_208 = local_290;
    LogicalType::ToString_abi_cxx11_((string *)&local_100,local_270);
    ::std::__cxx11::string::operator=((string *)&local_200,(string *)&local_100);
    ::std::__cxx11::string::~string((string *)&local_100);
    local_1e0 = (local_2a0->super_SegmentBase<duckdb::ColumnSegment>).start;
    local_1d8 = (local_2a0->super_SegmentBase<duckdb::ColumnSegment>).count.
                super___atomic_base<unsigned_long>._M_i;
    CompressionTypeToString_abi_cxx11_
              ((string *)&local_100,(duckdb *)(ulong)((local_2a0->function)._M_data)->type,type);
    ::std::__cxx11::string::operator=((string *)&local_1d0,(string *)&local_100);
    ::std::__cxx11::string::~string((string *)&local_100);
    ::std::mutex::lock((mutex *)&local_298->__data);
    BaseStatistics::ToString_abi_cxx11_((string *)&local_100,&(local_2a0->stats).statistics);
    ::std::__cxx11::string::operator=((string *)&local_1b0,(string *)&local_100);
    ::std::__cxx11::string::~string((string *)&local_100);
    pthread_mutex_unlock(local_298);
    local_190 = HasUpdates(local_278);
    local_18f = local_2a0->segment_type == PERSISTENT;
    if (local_18f) {
      local_188 = local_2a0->block_id;
      local_168 = local_2a0->offset;
    }
    pCVar1 = (local_2a0->function)._M_data;
    local_288._M_head_impl =
         (local_2a0->segment_state).
         super_unique_ptr<duckdb::CompressedSegmentState,_std::default_delete<duckdb::CompressedSegmentState>_>
         ._M_t.
         super___uniq_ptr_impl<duckdb::CompressedSegmentState,_std::default_delete<duckdb::CompressedSegmentState>_>
         ._M_t.
         super__Tuple_impl<0UL,_duckdb::CompressedSegmentState_*,_std::default_delete<duckdb::CompressedSegmentState>_>
         .super__Head_base<0UL,_duckdb::CompressedSegmentState_*,_false>._M_head_impl;
    if (local_288._M_head_impl != (CompressedSegmentState *)0x0) {
      pCVar6 = optional_ptr<duckdb::CompressedSegmentState,_true>::operator->
                         ((optional_ptr<duckdb::CompressedSegmentState,_true> *)&local_288);
      (*pCVar6->_vptr_CompressedSegmentState[2])(&local_100,pCVar6);
      ::std::__cxx11::string::operator=((string *)&local_160,(string *)&local_100);
      ::std::__cxx11::string::~string((string *)&local_100);
      pCVar6 = optional_ptr<duckdb::CompressedSegmentState,_true>::operator->
                         ((optional_ptr<duckdb::CompressedSegmentState,_true> *)&local_288);
      (*pCVar6->_vptr_CompressedSegmentState[3])(&local_100,pCVar6);
      ::std::vector<long,_std::allocator<long>_>::_M_move_assign(&local_180,&local_100);
      ::std::_Vector_base<long,_std::allocator<long>_>::~_Vector_base
                ((_Vector_base<long,_std::allocator<long>_> *)&local_100);
    }
    p_Var2 = pCVar1->get_segment_info;
    if (p_Var2 != (compression_get_segment_info_t)0x0) {
      (*p_Var2)(&local_100,local_2a0);
      ppVar3 = local_100.map.
               super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               .
               super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      local_248 = 0;
      local_258 = 0;
      uStack_250 = 0;
      for (ppVar7 = local_100.map.
                    super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    .
                    super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start; ppVar7 != ppVar3; ppVar7 = ppVar7 + 1
          ) {
        ::std::__cxx11::string::string(local_70,"%s: %s",(allocator *)&local_120);
        ::std::__cxx11::string::string((string *)&local_90,(string *)ppVar7);
        ::std::__cxx11::string::string((string *)&local_b0,(string *)&ppVar7->second);
        StringUtil::Format<std::__cxx11::string,std::__cxx11::string>
                  (&local_50,(StringUtil *)local_70,&local_90,&local_b0,in_R8);
        ::std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_258,
                   &local_50);
        ::std::__cxx11::string::~string((string *)&local_50);
        ::std::__cxx11::string::~string((string *)&local_b0);
        ::std::__cxx11::string::~string((string *)&local_90);
        ::std::__cxx11::string::~string(local_70);
      }
      ::std::__cxx11::string::string((string *)&local_120,", ",&local_2a1);
      StringUtil::Join(&local_50,
                       (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                        *)&local_258,&local_120);
      ::std::__cxx11::string::operator=((string *)&local_160,(string *)&local_50);
      ::std::__cxx11::string::~string((string *)&local_50);
      ::std::__cxx11::string::~string((string *)&local_120);
      ::std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&local_258);
      InsertionOrderPreservingMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~InsertionOrderPreservingMap(&local_100);
    }
    ::std::vector<duckdb::ColumnSegmentInfo,std::allocator<duckdb::ColumnSegmentInfo>>::
    emplace_back<duckdb::ColumnSegmentInfo&>(local_280,(ColumnSegmentInfo *)local_238);
    pCVar5 = (local_2a0->super_SegmentBase<duckdb::ColumnSegment>).next._M_b._M_p;
    local_290 = local_290 + 1;
    ColumnSegmentInfo::~ColumnSegmentInfo((ColumnSegmentInfo *)local_238);
  }
  ::std::__cxx11::string::~string(local_140);
  return;
}

Assistant:

void ColumnData::GetColumnSegmentInfo(idx_t row_group_index, vector<idx_t> col_path,
                                      vector<ColumnSegmentInfo> &result) {
	D_ASSERT(!col_path.empty());

	// convert the column path to a string
	string col_path_str = "[";
	for (idx_t i = 0; i < col_path.size(); i++) {
		if (i > 0) {
			col_path_str += ", ";
		}
		col_path_str += to_string(col_path[i]);
	}
	col_path_str += "]";

	// iterate over the segments
	idx_t segment_idx = 0;
	auto segment = data.GetRootSegment();
	while (segment) {
		ColumnSegmentInfo column_info;
		column_info.row_group_index = row_group_index;
		column_info.column_id = col_path[0];
		column_info.column_path = col_path_str;
		column_info.segment_idx = segment_idx;
		column_info.segment_type = type.ToString();
		column_info.segment_start = segment->start;
		column_info.segment_count = segment->count;
		column_info.compression_type = CompressionTypeToString(segment->GetCompressionFunction().type);
		{
			lock_guard<mutex> l(stats_lock);
			column_info.segment_stats = segment->stats.statistics.ToString();
		}
		column_info.has_updates = ColumnData::HasUpdates();
		// persistent
		// block_id
		// block_offset
		if (segment->segment_type == ColumnSegmentType::PERSISTENT) {
			column_info.persistent = true;
			column_info.block_id = segment->GetBlockId();
			column_info.block_offset = segment->GetBlockOffset();
		} else {
			column_info.persistent = false;
		}
		auto &compression_function = segment->GetCompressionFunction();
		auto segment_state = segment->GetSegmentState();
		if (segment_state) {
			column_info.segment_info = segment_state->GetSegmentInfo();
			column_info.additional_blocks = segment_state->GetAdditionalBlocks();
		}
		if (compression_function.get_segment_info) {
			auto segment_info = compression_function.get_segment_info(*segment);
			vector<string> sinfo;
			for (auto &item : segment_info) {
				auto &mode = item.first;
				auto &count = item.second;
				sinfo.push_back(StringUtil::Format("%s: %s", mode, count));
			}
			column_info.segment_info = StringUtil::Join(sinfo, ", ");
		}
		result.emplace_back(column_info);

		segment_idx++;
		segment = data.GetNextSegment(segment);
	}
}